

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O3

string * __thiscall MD5::unparse_abi_cxx11_(string *__return_storage_ptr__,MD5 *this)

{
  element_type *peVar1;
  size_type __dnew;
  Digest digest_val;
  string local_60;
  size_type local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  (*((this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_QPDFCryptoImpl[5])();
  (*((this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_QPDFCryptoImpl[5])();
  peVar1 = (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_QPDFCryptoImpl[6])(peVar1,&local_38);
  local_40 = 0x10;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_40);
  local_60.field_2._M_allocated_capacity = local_40;
  *(undefined8 *)local_60._M_dataplus._M_p = local_38;
  *(undefined8 *)(local_60._M_dataplus._M_p + 8) = uStack_30;
  local_60._M_string_length = local_40;
  local_60._M_dataplus._M_p[local_40] = '\0';
  QUtil::hex_encode(__return_storage_ptr__,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
MD5::unparse()
{
    this->crypto->MD5_finalize();
    Digest digest_val;
    digest(digest_val);
    return QUtil::hex_encode(std::string(reinterpret_cast<char*>(digest_val), 16));
}